

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O2

CreateMultisigResponseStruct *
cfd::js::api::AddressApiBase::CreateMultisig
          (CreateMultisigResponseStruct *__return_storage_ptr__,CreateMultisigRequestStruct *request
          ,AddressFactory *address_factory)

{
  byte bVar1;
  pointer pbVar2;
  AddressType AVar3;
  CreateMultisigResponseStruct *this;
  char cVar4;
  CfdException *this_00;
  Script *pSVar5;
  pointer pbVar6;
  allocator local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  AddressType local_2f0;
  AddressType addr_type;
  CreateMultisigResponseStruct *local_2e8;
  AddressFactory *local_2e0;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  Script witness_script;
  Script redeem_script;
  Script multisig_script;
  Script scriptsig;
  Script locking_script;
  Address addr;
  
  local_2e8 = __return_storage_ptr__;
  CreateMultisigResponseStruct::CreateMultisigResponseStruct(__return_storage_ptr__);
  local_2f0 = ConvertAddressType(&request->hash_type);
  addr_type = local_2f0;
  local_2e0 = address_factory;
  if (local_2f0 != kP2shP2wshAddress && (local_2f0 & kP2shP2wshAddress) != kP2shAddress) {
    _addr = "cfdjs_address_base.cpp";
    core::logger::warn<cfd::core::AddressType&>
              ((CfdSourceLocation *)&addr,
               "Failed to CreateMultisig. Invalid address_type passed:  addressType={}",&addr_type);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,
               "Invalid address_type. address_type must be \"p2sh\" \"p2wsh\" or \"p2sh-p2wsh\".",
               (allocator *)&witness_script);
    core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar2 = (request->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (request->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
    std::__cxx11::string::string((string *)&addr,(string *)pbVar6);
    cfd::core::Pubkey::Pubkey((Pubkey *)&witness_script,(string *)&addr);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
    emplace_back<cfd::core::Pubkey>(&pubkeys,(Pubkey *)&witness_script);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_script);
    std::__cxx11::string::~string((string *)&addr);
  }
  bVar1 = request->nrequired;
  cfd::core::Script::Script(&witness_script);
  this = local_2e8;
  cfd::core::Script::Script(&redeem_script);
  AVar3 = local_2f0;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((uint)&multisig_script,(vector *)(ulong)bVar1,SUB81(&pubkeys,0));
  cfd::core::Script::Script(&locking_script);
  cfd::core::Script::Script(&scriptsig);
  pSVar5 = &multisig_script;
  cfd::AddressFactory::CreateAddress
            ((AddressType)&addr,(Pubkey *)local_2e0,(Script *)(ulong)AVar3,(Script *)0x0,pSVar5);
  if (AVar3 != kP2shAddress) {
    cfd::core::Script::operator=(&witness_script,&multisig_script);
    pSVar5 = &scriptsig;
    cVar4 = cfd::core::Script::IsEmpty();
    if (cVar4 != '\0') goto LAB_0087a965;
  }
  cfd::core::Script::operator=(&redeem_script,pSVar5);
LAB_0087a965:
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  cVar4 = cfd::core::Script::IsEmpty();
  if (cVar4 == '\0') {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&this->redeem_script);
  }
  else {
    std::__cxx11::string::string((string *)&local_310,"redeemScript",&local_311);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->ignore_items,&local_310);
  }
  std::__cxx11::string::~string((string *)&local_310);
  cVar4 = cfd::core::Script::IsEmpty();
  if (cVar4 == '\0') {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&this->witness_script);
  }
  else {
    std::__cxx11::string::string((string *)&local_310,"witnessScript",&local_311);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->ignore_items,&local_310);
  }
  std::__cxx11::string::~string((string *)&local_310);
  core::Address::~Address(&addr);
  core::Script::~Script(&scriptsig);
  core::Script::~Script(&locking_script);
  core::Script::~Script(&multisig_script);
  core::Script::~Script(&redeem_script);
  core::Script::~Script(&witness_script);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
  return this;
}

Assistant:

CreateMultisigResponseStruct AddressApiBase::CreateMultisig(
    const CreateMultisigRequestStruct& request,
    const AddressFactory* address_factory) {
  CreateMultisigResponseStruct response;
  AddressType addr_type = ConvertAddressType(request.hash_type);
  if ((addr_type != AddressType::kP2shAddress) &&
      (addr_type != AddressType::kP2wshAddress) &&
      (addr_type != AddressType::kP2shP2wshAddress)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        addr_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2sh\" "
        "\"p2wsh\" or \"p2sh-p2wsh\".");  // NOLINT
  }
  std::vector<Pubkey> pubkeys;
  for (std::string key : request.keys) {
    pubkeys.push_back(Pubkey(key));
  }

  uint32_t req_sig_num = static_cast<uint32_t>(request.nrequired);
  Script witness_script;
  Script redeem_script;

  bool is_witness = (addr_type != AddressType::kP2shAddress);
  Script multisig_script =
      ScriptUtil::CreateMultisigRedeemScript(req_sig_num, pubkeys, is_witness);
  Script locking_script;
  Script scriptsig;
  Address addr = address_factory->CreateAddress(
      addr_type, nullptr, &multisig_script, &locking_script, &scriptsig);
  if (is_witness) {
    witness_script = multisig_script;
    if (!scriptsig.IsEmpty()) {
      redeem_script = scriptsig;
    }
  } else {
    redeem_script = multisig_script;
  }

  response.address = addr.GetAddress();
  if (redeem_script.IsEmpty()) {
    response.ignore_items.insert("redeemScript");
  } else {
    response.redeem_script = redeem_script.GetHex();
  }
  if (witness_script.IsEmpty()) {
    response.ignore_items.insert("witnessScript");
  } else {
    response.witness_script = witness_script.GetHex();
  }
  return response;
}